

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_StdPreReordHook(DdManager *dd,char *str,void *data)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  long local_50;
  int local_30;
  int retval;
  Cudd_ReorderingType method;
  void *data_local;
  char *str_local;
  DdManager *dd_local;
  
  iVar2 = (int)data;
  iVar1 = fprintf((FILE *)dd->out,"%s reordering with ",str);
  if (iVar1 == -1) {
    dd_local._4_4_ = 0;
  }
  else if (((((iVar2 == 5) || (iVar2 == 7)) || (iVar2 - 0xbU < 3)) ||
           ((iVar2 == 0xf || (iVar2 == 0x13)))) &&
          (iVar1 = fprintf((FILE *)dd->out,"converging "), iVar1 == -1)) {
    dd_local._4_4_ = 0;
  }
  else {
    switch(iVar2) {
    case 2:
    case 3:
      local_30 = fprintf((FILE *)dd->out,"random");
      break;
    case 4:
    case 5:
      local_30 = fprintf((FILE *)dd->out,"sifting");
      break;
    case 6:
    case 7:
      local_30 = fprintf((FILE *)dd->out,"symmetric sifting");
      break;
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
      local_30 = fprintf((FILE *)dd->out,"window");
      break;
    case 0xe:
    case 0xf:
      local_30 = fprintf((FILE *)dd->out,"group sifting");
      break;
    case 0x10:
      local_30 = fprintf((FILE *)dd->out,"annealing");
      break;
    case 0x11:
      local_30 = fprintf((FILE *)dd->out,"genetic");
      break;
    case 0x12:
    case 0x13:
      local_30 = fprintf((FILE *)dd->out,"linear sifting");
      break;
    case 0x14:
      local_30 = fprintf((FILE *)dd->out,"lazy sifting");
      break;
    case 0x15:
      local_30 = fprintf((FILE *)dd->out,"exact");
      break;
    default:
      return 0;
    }
    if (local_30 == -1) {
      dd_local._4_4_ = 0;
    }
    else {
      __stream = (FILE *)dd->out;
      iVar2 = strcmp(str,"BDD");
      if (iVar2 == 0) {
        local_50 = Cudd_ReadNodeCount(dd);
      }
      else {
        local_50 = Cudd_zddReadNodeCount(dd);
      }
      iVar2 = fprintf(__stream,": from %ld to ... ",local_50);
      if (iVar2 == -1) {
        dd_local._4_4_ = 0;
      }
      else {
        fflush((FILE *)dd->out);
        dd_local._4_4_ = 1;
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_StdPreReordHook(
  DdManager *dd,
  const char *str,
  void *data)
{
    Cudd_ReorderingType method = (Cudd_ReorderingType) (ptruint) data;
    int retval;

    retval = fprintf(dd->out,"%s reordering with ", str);
    if (retval == EOF) return(0);
    switch (method) {
    case CUDD_REORDER_SIFT_CONVERGE:
    case CUDD_REORDER_SYMM_SIFT_CONV:
    case CUDD_REORDER_GROUP_SIFT_CONV:
    case CUDD_REORDER_WINDOW2_CONV:
    case CUDD_REORDER_WINDOW3_CONV:
    case CUDD_REORDER_WINDOW4_CONV:
    case CUDD_REORDER_LINEAR_CONVERGE:
        retval = fprintf(dd->out,"converging ");
        if (retval == EOF) return(0);
        break;
    default:
        break;
    }
    switch (method) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
        retval = fprintf(dd->out,"random");
        break;
    case CUDD_REORDER_SIFT:
    case CUDD_REORDER_SIFT_CONVERGE:
        retval = fprintf(dd->out,"sifting");
        break;
    case CUDD_REORDER_SYMM_SIFT:
    case CUDD_REORDER_SYMM_SIFT_CONV:
        retval = fprintf(dd->out,"symmetric sifting");
        break;
    case CUDD_REORDER_LAZY_SIFT:
        retval = fprintf(dd->out,"lazy sifting");
        break;
    case CUDD_REORDER_GROUP_SIFT:
    case CUDD_REORDER_GROUP_SIFT_CONV:
        retval = fprintf(dd->out,"group sifting");
        break;
    case CUDD_REORDER_WINDOW2:
    case CUDD_REORDER_WINDOW3:
    case CUDD_REORDER_WINDOW4:
    case CUDD_REORDER_WINDOW2_CONV:
    case CUDD_REORDER_WINDOW3_CONV:
    case CUDD_REORDER_WINDOW4_CONV:
        retval = fprintf(dd->out,"window");
        break;
    case CUDD_REORDER_ANNEALING:
        retval = fprintf(dd->out,"annealing");
        break;
    case CUDD_REORDER_GENETIC:
        retval = fprintf(dd->out,"genetic");
        break;
    case CUDD_REORDER_LINEAR:
    case CUDD_REORDER_LINEAR_CONVERGE:
        retval = fprintf(dd->out,"linear sifting");
        break;
    case CUDD_REORDER_EXACT:
        retval = fprintf(dd->out,"exact");
        break;
    default:
        return(0);
    }
    if (retval == EOF) return(0);

    retval = fprintf(dd->out,": from %ld to ... ", strcmp(str, "BDD") == 0 ?
                     Cudd_ReadNodeCount(dd) : Cudd_zddReadNodeCount(dd));
    if (retval == EOF) return(0);
    fflush(dd->out);
    return(1);

}